

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

element * __thiscall MinVR::element::operator=(element *this,element *the_element)

{
  element *in_RSI;
  element *in_RDI;
  element *in_stack_ffffffffffffff78;
  element *in_stack_ffffffffffffff88;
  list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *__x;
  string *in_stack_ffffffffffffff90;
  element *in_stack_ffffffffffffff98;
  list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> local_30 [2];
  
  get_name(in_RSI);
  set_name(in_stack_ffffffffffffff88,(char *)in_RDI);
  __x = local_30;
  get_value_abi_cxx11_(in_stack_ffffffffffffff78);
  set_value(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)local_30);
  get_element_list_abi_cxx11_(in_stack_ffffffffffffff78);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::operator=
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)in_stack_ffffffffffffff90,
             (list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)__x);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::~list
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)0x1367a3);
  get_attribute_list_abi_cxx11_(in_stack_ffffffffffffff78);
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::operator=
            ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)
             in_stack_ffffffffffffff90,__x);
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::~list
            ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)0x1367cb);
  return in_RDI;
}

Assistant:

element* element::operator = ( element* the_element)
{
    set_name(the_element->get_name());
    set_value(the_element->get_value());
    m_element_list = the_element->get_element_list();
    m_attribute_list = the_element->get_attribute_list();
    return this;
}